

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outdata_reply.c
# Opt level: O2

int mpt_outdata_reply(mpt_outdata *out,size_t len,void *hdr,mpt_message *src)

{
  size_t *psVar1;
  byte bVar2;
  uint __addr_len;
  sockaddr *psVar3;
  long lVar4;
  uint8_t *__dest;
  ssize_t sVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  ulong __n;
  mpt_message msg;
  uint8_t tmp [256];
  
  iVar7 = (out->sock)._id;
  if (iVar7 < 0) {
    iVar7 = -1;
  }
  else {
    bVar6 = out->_idlen;
    __n = (ulong)bVar6;
    bVar2 = out->_smax;
    if (len < __n || __n + bVar2 < len) {
      iVar7 = -2;
    }
    else {
      if (__n != 0) {
        memcpy(tmp,hdr,__n);
        hdr = (void *)((long)hdr + __n);
      }
      psVar3 = (sockaddr *)0x0;
      if (bVar2 == 0) {
        hdr = psVar3;
      }
      bVar6 = (char)len - bVar6;
      if (bVar6 == 0) {
        hdr = psVar3;
      }
      __addr_len = (uint)bVar6;
      if (bVar2 == 0) {
        __addr_len = 0;
      }
      if (src == (mpt_message *)0x0) {
        __dest = tmp;
      }
      else {
        msg.used._0_4_ = (undefined4)src->used;
        msg.used._4_4_ = *(undefined4 *)((long)&src->used + 4);
        msg.base._0_4_ = *(undefined4 *)&src->base;
        msg.base._4_4_ = *(undefined4 *)((long)&src->base + 4);
        msg.cont._0_4_ = *(undefined4 *)&src->cont;
        msg.cont._4_4_ = *(undefined4 *)((long)&src->cont + 4);
        msg.clen._0_4_ = (undefined4)src->clen;
        msg.clen._4_4_ = *(undefined4 *)((long)&src->clen + 4);
        psVar3 = (sockaddr *)mpt_message_read(&msg,0x100 - __n,tmp + __n);
        lVar4 = mpt_message_length(&msg);
        if (lVar4 == 0) {
          __dest = tmp;
        }
        else {
          pcVar8 = psVar3->sa_data + lVar4 + __n + -2;
          __dest = (uint8_t *)mpt_array_append(out,pcVar8,0);
          if (__dest == (uint8_t *)0x0) {
            return -0x11;
          }
          psVar1 = &((out->buf)._buf)->_used;
          *psVar1 = *psVar1 - (long)pcVar8;
          if (__n != 0) {
            memcpy(__dest,hdr,__n);
          }
          psVar3 = (sockaddr *)mpt_message_read(&msg,(long)pcVar8 - __n,__dest + __n);
        }
        iVar7 = (out->sock)._id;
      }
      sVar5 = sendto(iVar7,__dest,(size_t)(psVar3->sa_data + (__n - 2)),0,(sockaddr *)hdr,__addr_len
                    );
      iVar7 = -4;
      if (-1 < (int)sVar5) {
        iVar7 = (int)sVar5;
      }
    }
  }
  return iVar7;
}

Assistant:

extern int mpt_outdata_reply(MPT_STRUCT(outdata) *out, size_t len, const void *hdr, const MPT_STRUCT(message) *src)
{
	uint8_t tmp[0x100]; /* 256b reply limit */
	uint8_t *ptr = tmp;
	int ret;
	uint8_t ilen, slen;
	uint16_t max;
	
	/* already answered */
	if (!MPT_socket_active(&out->sock)) {
		return MPT_ERROR(BadArgument);
	}
	ilen = out->_idlen;
	slen = out->_smax;
	max = ilen + slen;
	
	if (len > max || len < ilen) {
		return MPT_ERROR(BadValue);
	}
	if (ilen) {
		memcpy(tmp, hdr, ilen);
		hdr = ((uint8_t *) hdr) + ilen;
	}
	if (!slen || !(slen = len - ilen)) {
		hdr = 0;
	}
	len = 0;
	if (src) {
		MPT_STRUCT(message) msg = *src;
		size_t left;
		len = mpt_message_read(&msg, sizeof(tmp) - ilen, tmp + ilen);
		/* temporary reply limit exceeded */
		if ((left = mpt_message_length(&msg))) {
			len += ilen + left;
			/* use temporary data in unused buffer segment */
			if (!(ptr = mpt_array_append(&out->buf, len, 0))) {
				return MPT_ERROR(MissingBuffer);
			}
			out->buf._buf->_used -= len;
			if (ilen) {
				memcpy(ptr, hdr, ilen);
			}
			len = mpt_message_read(&msg, len - ilen, ptr + ilen);
		}
	}
	ret = sendto(out->sock._id, ptr, ilen + len, 0, hdr, slen);
	
	if (ret < 0) {
		return MPT_ERROR(BadOperation);
	}
	return ret;
}